

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O3

uint32_t event_track::find_sample_boundaries
                   (vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                    *emsgs_in,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> *sample_boundaries,
                   uint64_t segment_start,uint64_t segment_end)

{
  pointer puVar1;
  unsigned_long uVar2;
  long lVar3;
  pointer pDVar4;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  unsigned_long uVar7;
  ulong uVar8;
  unsigned_long *puVar9;
  ulong uVar10;
  iterator iVar11;
  const_iterator __cbeg;
  unsigned_long *puVar12;
  bool bVar13;
  uint64_t pt;
  unsigned_long local_50;
  unsigned_long local_48;
  ulong local_40;
  uint64_t local_38;
  
  puVar1 = (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
           _M_impl.super__Vector_impl_data._M_start;
  (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = segment_end;
  local_38 = segment_start;
  if (puVar1 == (pointer)0x0) {
    iVar11._M_current = (unsigned_long *)0x0;
  }
  else {
    operator_delete(puVar1);
    iVar11._M_current =
         (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current !=
        (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      *iVar11._M_current = segment_start;
      (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
      .super__Vector_impl_data._M_finish = iVar11._M_current + 1;
      goto LAB_00158eea;
    }
  }
  std::vector<unsigned_long,std::allocator<unsigned_long>>::_M_realloc_insert<unsigned_long_const&>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)sample_boundaries,iVar11,
             &local_38);
LAB_00158eea:
  if (local_50 != 0) {
    iVar11._M_current =
         (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)sample_boundaries,iVar11,
                 &local_50);
    }
    else {
      *iVar11._M_current = local_50;
      (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
      .super__Vector_impl_data._M_finish = iVar11._M_current + 1;
    }
  }
  pDVar4 = (emsgs_in->
           super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((emsgs_in->
      super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
      )._M_impl.super__Vector_impl_data._M_finish != pDVar4) {
    uVar8 = 0;
    uVar10 = 1;
    do {
      local_40 = pDVar4[uVar8].presentation_time_;
      local_48 = pDVar4[uVar8].event_duration_ + local_40 +
                 (ulong)((ulong)pDVar4[uVar8].event_duration_ == 0);
      if (local_40 < local_38) {
LAB_00158f9b:
        if (local_50 != 0) goto LAB_00158faf;
LAB_00158fe3:
        iVar11._M_current =
             (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar11._M_current ==
            (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)sample_boundaries,iVar11
                     ,&local_48);
        }
        else {
          *iVar11._M_current = local_48;
          (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
          _M_impl.super__Vector_impl_data._M_finish = iVar11._M_current + 1;
        }
      }
      else {
        if (local_40 <= local_50 - 1) {
          iVar11._M_current =
               (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar11._M_current ==
              (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)sample_boundaries,
                       iVar11,&local_40);
          }
          else {
            *iVar11._M_current = local_40;
            (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
            _M_impl.super__Vector_impl_data._M_finish = iVar11._M_current + 1;
          }
          goto LAB_00158f9b;
        }
LAB_00158faf:
        if ((local_48 < local_50) && (local_38 <= local_48)) {
          iVar11._M_current =
               (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar11._M_current ==
              (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)sample_boundaries,
                       iVar11,&local_48);
          }
          else {
            *iVar11._M_current = local_48;
            (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
            _M_impl.super__Vector_impl_data._M_finish = iVar11._M_current + 1;
          }
        }
        if (local_50 == 0) goto LAB_00158fe3;
      }
      pDVar4 = (emsgs_in->
               super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(emsgs_in->
                     super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar4 >> 3) *
              -0x7b425ed097b425ed;
      bVar13 = uVar10 <= uVar8;
      lVar3 = uVar8 - uVar10;
      uVar8 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar13 && lVar3 != 0);
  }
  iVar11._M_current =
       (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (local_50 != 0) {
    if (iVar11._M_current ==
        (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)sample_boundaries,iVar11,
                 &local_50);
      iVar11._M_current =
           (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      *iVar11._M_current = local_50;
      iVar11._M_current = iVar11._M_current + 1;
      (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
      .super__Vector_impl_data._M_finish = iVar11._M_current;
    }
  }
  puVar12 = (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if (puVar12 != iVar11._M_current) {
    uVar8 = (long)iVar11._M_current - (long)puVar12 >> 3;
    lVar3 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar12,iVar11._M_current,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar12,iVar11._M_current);
    puVar12 = (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    iVar11._M_current =
         (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
         _M_impl.super__Vector_impl_data._M_finish;
  }
  if (puVar12 != iVar11._M_current) {
    puVar9 = puVar12 + 1;
    do {
      puVar5 = puVar9;
      if (puVar5 == iVar11._M_current) goto LAB_001590ea;
      puVar9 = puVar5 + 1;
    } while (puVar5[-1] != *puVar5);
    puVar6 = puVar5 + -1;
    uVar7 = puVar5[-1];
    for (; puVar9 != iVar11._M_current; puVar9 = puVar9 + 1) {
      uVar2 = *puVar9;
      if (uVar7 != uVar2) {
        puVar6[1] = uVar2;
        puVar6 = puVar6 + 1;
      }
      uVar7 = uVar2;
    }
    puVar6 = puVar6 + 1;
    if (puVar6 != iVar11._M_current) {
      (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
      .super__Vector_impl_data._M_finish = puVar6;
      iVar11._M_current = puVar6;
    }
  }
LAB_001590ea:
  if (local_50 == 0) {
    local_40 = iVar11._M_current[-1] + 1;
    if (iVar11._M_current ==
        (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (sample_boundaries,(iterator)iVar11._M_current,&local_40);
      iVar11._M_current =
           (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
           _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      *iVar11._M_current = local_40;
      iVar11._M_current = iVar11._M_current + 1;
      (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
      .super__Vector_impl_data._M_finish = iVar11._M_current;
    }
    puVar12 = (sample_boundaries->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
              ._M_impl.super__Vector_impl_data._M_start;
  }
  return (uint32_t)((ulong)((long)iVar11._M_current - (long)puVar12) >> 3);
}

Assistant:

uint32_t event_track::find_sample_boundaries(
	const std::vector<DASHEventMessageBoxv1> &emsgs_in,
	std::vector<uint64_t> &sample_boundaries,
	uint64_t segment_start,
	uint64_t segment_end )
{

	sample_boundaries = std::vector<uint64_t>();
	sample_boundaries.push_back(segment_start);

	if (segment_end != 0)
		sample_boundaries.push_back(segment_end);

	for (uint32_t k = 0; k < emsgs_in.size(); k++)
	{
		uint64_t pt = emsgs_in[k].presentation_time_;
		uint64_t pt_du = emsgs_in[k].presentation_time_ + emsgs_in[k].event_duration_;

		if (emsgs_in[k].event_duration_ == 0)
			pt_du += 1;  // set the sample duration to a single tick

						 // boundaries due to events starting
		if (pt >= segment_start)  // event starts  
			if (segment_end == 0 || pt < segment_end)
				sample_boundaries.push_back(pt);

		// boundaries due to event ending
		if (segment_end != 0)
			if (pt_du >= segment_start && pt_du < segment_end)
				sample_boundaries.push_back(pt_du);

		if (segment_end == 0)
			sample_boundaries.push_back(pt_du);
	}

	if (segment_end != 0)
		sample_boundaries.push_back(segment_end);

	sort(sample_boundaries.begin(), sample_boundaries.end());
	sample_boundaries.erase(std::unique(sample_boundaries.begin(),
		sample_boundaries.end()), sample_boundaries.end());

	if (segment_end == 0)
		sample_boundaries.push_back(sample_boundaries[sample_boundaries.size() - 1] + 1);

	return (uint32_t)sample_boundaries.size();
}